

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O0

shared_ptr<cornelich::region> __thiscall
cornelich::util::
cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::
get<cornelich::vanilla_index::index_for(int,int,bool)::__0&>
          (cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>
           *this,tuple<int,_int> *k,anon_class_16_2_34bf9f15 *provider)

{
  bool bVar1;
  type *this_00;
  iterator position;
  type i;
  _Tuple_impl<0UL,_int,_int> _Var2;
  pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_> *ppVar3;
  key_t *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pair<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_>,_bool>
  pVar5;
  shared_ptr<cornelich::region> sVar6;
  pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_> local_a8;
  sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
  *local_90;
  pair<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_>,_bool>
  element;
  undefined1 local_70 [8];
  shared_ptr<cornelich::region> v;
  type *sequence_index;
  hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
  local_38;
  iterator it;
  type *index;
  anon_class_16_2_34bf9f15 *provider_local;
  tuple<int,_int> *k_local;
  cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>
  *this_local;
  
  it.node = (hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
             *)boost::multi_index::
               multi_index_container<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>
               ::
               get<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key>
                         ((multi_index_container<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>
                           *)(k + 2));
  local_38.node =
       (hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
        *)boost::multi_index::detail::
          hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
          ::find<std::tuple<int,int>>
                    ((hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
                      *)it.node,(tuple<int,_int> *)provider);
  sequence_index =
       (type *)boost::multi_index::detail::
               hashed_index<boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_boost::hash<std::tuple<int,_int>_>,_std::equal_to<std::tuple<int,_int>_>,_boost::multi_index::detail::nth_layer<2,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::hashed_unique_tag>
               ::end((hashed_index<boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_boost::hash<std::tuple<int,_int>_>,_std::equal_to<std::tuple<int,_int>_>,_boost::multi_index::detail::nth_layer<2,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::hashed_unique_tag>
                      *)it.node);
  bVar1 = boost::operators_impl::operator!=
                    (&local_38,
                     (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                      *)&sequence_index);
  if (bVar1) {
    this_00 = boost::multi_index::
              multi_index_container<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>
              ::
              get<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence>
                        ((multi_index_container<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>
                          *)(k + 2));
    position = boost::multi_index::detail::
               sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
               ::end(this_00);
    v.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.node;
    i = boost::multi_index::
        project<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>>,boost::multi_index::detail::bucket_array<std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>
                  ((multi_index_container<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                    *)(k + 2),local_38);
    boost::multi_index::detail::
    sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
    ::relocate(this_00,position,(iterator)i.node);
    ppVar3 = boost::operators_impl::
             dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_long,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_*,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_&>_>
             ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_long,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_*,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_&>_>
                           *)&local_38);
    std::shared_ptr<cornelich::region>::shared_ptr
              ((shared_ptr<cornelich::region> *)this,&ppVar3->second);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    vanilla_index::index_for::anon_class_16_2_34bf9f15::operator()
              ((anon_class_16_2_34bf9f15 *)local_70,in_RCX);
    bVar1 = region_ptr_validator::operator()((region_ptr_validator *)(k + 1),(region_ptr *)local_70)
    ;
    if (bVar1) {
      _Var2 = (_Tuple_impl<0UL,_int,_int>)
              boost::multi_index::detail::
              sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
              ::size((sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
                      *)(k + 4));
      if ((ulong)k->super__Tuple_impl<0UL,_int,_int> <= (ulong)_Var2) {
        boost::multi_index::detail::
        sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
        ::pop_front((sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
                     *)(k + 4));
      }
      std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>::
      pair<std::shared_ptr<cornelich::region>_&,_true>
                (&local_a8,(tuple<int,_int> *)provider,(shared_ptr<cornelich::region> *)local_70);
      pVar5 = boost::multi_index::detail::
              sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
              ::push_back((sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
                           *)(k + 4),&local_a8);
      local_90 = (sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
                  *)pVar5.first.node;
      element.first.node._0_1_ = pVar5.second;
      std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>::~pair(&local_a8);
      ppVar3 = boost::operators_impl::
               dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_>,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_long,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_*,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_&>_>_>
               ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_>,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_long,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_*,_const_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_&>_>_>
                             *)&local_90);
      std::shared_ptr<cornelich::region>::shared_ptr
                ((shared_ptr<cornelich::region> *)this,&ppVar3->second);
    }
    else {
      std::shared_ptr<cornelich::region>::shared_ptr
                ((shared_ptr<cornelich::region> *)this,(shared_ptr<cornelich::region> *)local_70);
    }
    element.second = true;
    element._9_3_ = 0;
    std::shared_ptr<cornelich::region>::~shared_ptr((shared_ptr<cornelich::region> *)local_70);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar6.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar6.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cornelich::region>)
         sVar6.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline V cache<K, V, Validator>::get(const K & k, Provider && provider) const
{
    // Use the key index to check if we have that {k, v}
    auto & index = m_container.template get<tag_key>();
    auto it = index.find(k);
    if(it != index.end())
    {
        // We have it, mark it as the most recently used and we're done
        auto & sequence_index = m_container.template get<tag_sequence>();
        sequence_index.relocate(sequence_index.end(), boost::multi_index::project<tag_sequence>(m_container, it));
        return it->second;
    }

    // Compute the value
    auto v = provider(k);
    if(!m_validator(v)) // Don't store the {k, v} if not validated
        return v;

    // Evict the LRU entry if needed
    if(m_container.size() >= m_capacity) {
        m_container.pop_front();
    }

    auto element = m_container.push_back({k, v});
    return element.first->second;
}